

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O0

void __thiscall aggreports::NormalisePeriodWeights(aggreports *this)

{
  int iVar1;
  bool bVar2;
  pointer ppVar3;
  _Self local_20;
  _Self local_18;
  iterator iter;
  aggreports *this_local;
  
  if (this->samplesize_ != 0) {
    iter._M_node = (_Base_ptr)this;
    local_18._M_node =
         (_Base_ptr)
         std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
         begin(&this->periodstoweighting_);
    while( true ) {
      local_20._M_node =
           (_Base_ptr)
           std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
           end(&this->periodstoweighting_);
      bVar2 = std::operator!=(&local_18,&local_20);
      if (!bVar2) break;
      iVar1 = this->samplesize_;
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_double>_>::operator->(&local_18);
      ppVar3->second = ppVar3->second / (double)iVar1;
      std::_Rb_tree_iterator<std::pair<const_int,_double>_>::operator++(&local_18);
    }
  }
  return;
}

Assistant:

void aggreports::NormalisePeriodWeights() {

  if (samplesize_) {
    for (auto iter = periodstoweighting_.begin();
	 iter != periodstoweighting_.end(); ++iter) {
      iter->second /= samplesize_;
    }
  }

}